

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O0

void __thiscall
OpenMD::InversePowerSeries::addExplicitInteraction
          (InversePowerSeries *this,AtomType *atype1,AtomType *atype2,
          vector<int,_std::allocator<int>_> *powers,
          vector<double,_std::allocator<double>_> *coefficients)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  InversePowerSeriesInteractionData *this_00;
  reference pvVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
  *in_R8;
  int nInversePowerSeries;
  int ipstid2;
  int ipstid1;
  InversePowerSeriesInteractionData mixer;
  InversePowerSeriesInteractionData *in_stack_ffffffffffffff48;
  InversePowerSeriesInteractionData *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  
  InversePowerSeriesInteractionData::InversePowerSeriesInteractionData(in_stack_ffffffffffffff50);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDX
            );
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDX);
  iVar2 = AtomType::getIdent(in_RSI);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
  iVar1 = *pvVar4;
  this_00 = (InversePowerSeriesInteractionData *)(in_RDI + 0x40);
  iVar3 = AtomType::getIdent(in_RDX);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this_00->powers,(long)iVar3);
  iVar3 = *pvVar4;
  std::set<int,_std::less<int>,_std::allocator<int>_>::size
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2e2ca8);
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
            *)in_R8,CONCAT44(iVar2,in_stack_ffffffffffffff68));
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                *)(in_RDI + 0x58),(long)iVar1);
  std::
  vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
  ::resize(in_R8,CONCAT44(iVar2,in_stack_ffffffffffffff68));
  pvVar5 = std::
           vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                         *)(in_RDI + 0x58),(long)iVar1);
  std::
  vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
  ::operator[](pvVar5,(long)iVar3);
  InversePowerSeriesInteractionData::operator=(this_00,in_stack_ffffffffffffff48);
  if (iVar3 != iVar1) {
    std::
    vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                  *)(in_RDI + 0x58),(long)iVar3);
    std::
    vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
    ::resize(in_R8,CONCAT44(iVar2,in_stack_ffffffffffffff68));
    pvVar5 = std::
             vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                           *)(in_RDI + 0x58),(long)iVar3);
    std::
    vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
    ::operator[](pvVar5,(long)iVar1);
    InversePowerSeriesInteractionData::operator=(this_00,in_stack_ffffffffffffff48);
  }
  InversePowerSeriesInteractionData::~InversePowerSeriesInteractionData(this_00);
  return;
}

Assistant:

void InversePowerSeries::addExplicitInteraction(
      AtomType* atype1, AtomType* atype2, std::vector<int> powers,
      std::vector<RealType> coefficients) {
    InversePowerSeriesInteractionData mixer;
    mixer.powers       = powers;
    mixer.coefficients = coefficients;

    int ipstid1             = InversePowerSeriesTids[atype1->getIdent()];
    int ipstid2             = InversePowerSeriesTids[atype2->getIdent()];
    int nInversePowerSeries = InversePowerSeriesTypes.size();

    MixingMap.resize(nInversePowerSeries);
    MixingMap[ipstid1].resize(nInversePowerSeries);

    MixingMap[ipstid1][ipstid2] = mixer;
    if (ipstid2 != ipstid1) {
      MixingMap[ipstid2].resize(nInversePowerSeries);
      MixingMap[ipstid2][ipstid1] = mixer;
    }
  }